

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int select_cipher(ptls_cipher_suite_t **selected,ptls_cipher_suite_t **candidates,uint8_t *src,
                 uint8_t *end,int server_preference,int server_chacha_priority,
                 ptls_hash_algorithm_t *hash)

{
  ptls_cipher_suite_t *ppVar1;
  int iVar2;
  ushort uVar3;
  ulong uVar4;
  ulong uVar5;
  ptls_cipher_suite_t *ppVar6;
  
  iVar2 = 0x28;
  if (src != end) {
    uVar4 = 0xffffffffffffffff;
    while (1 < (long)end - (long)src) {
      ppVar1 = *candidates;
      if (ppVar1 != (ptls_cipher_suite_t *)0x0) {
        uVar3 = *(ushort *)src << 8 | *(ushort *)src >> 8;
        uVar5 = 0;
        ppVar6 = ppVar1;
        do {
          if ((ppVar6->id == uVar3) &&
             ((hash == (ptls_hash_algorithm_t *)0x0 || (ppVar6->hash == hash)))) {
            if (uVar3 == 0x1303 && server_chacha_priority != 0 || server_preference == 0)
            goto LAB_00120868;
            if (uVar5 < uVar4) {
              server_chacha_priority = 0;
              ppVar6 = ppVar1;
              if (uVar5 != 0) goto LAB_00120838;
              goto LAB_00120868;
            }
          }
          ppVar6 = candidates[uVar5 + 1];
          uVar5 = uVar5 + 1;
        } while (ppVar6 != (ptls_cipher_suite_t *)0x0);
      }
      uVar5 = uVar4;
      if (uVar4 != 0) {
        server_chacha_priority = 0;
      }
LAB_00120838:
      src = (uint8_t *)((long)src + 2);
      uVar4 = uVar5;
      if (src == end) {
        if (uVar5 == 0xffffffffffffffff) {
          return 0x28;
        }
        ppVar6 = candidates[uVar5];
LAB_00120868:
        *selected = ppVar6;
        return 0;
      }
    }
    iVar2 = 0x32;
  }
  return iVar2;
}

Assistant:

static int select_cipher(ptls_cipher_suite_t **selected, ptls_cipher_suite_t **candidates, const uint8_t *src,
                         const uint8_t *const end, int server_preference, int server_chacha_priority, ptls_hash_algorithm_t *hash)
{
    size_t found_index = SIZE_MAX;
    int ret;

    while (src != end) {
        uint16_t id;
        if ((ret = ptls_decode16(&id, &src, end)) != 0)
            goto Exit;
        for (size_t i = 0; candidates[i] != NULL; ++i) {
            if (candidates[i]->id == id && (hash == NULL || candidates[i]->hash == hash)) {
                if (server_preference && !(server_chacha_priority && id == PTLS_CIPHER_SUITE_CHACHA20_POLY1305_SHA256)) {
                    /* preserve smallest matching index, and proceed to the next input */
                    if (i < found_index) {
                        found_index = i;
                        break;
                    }
                } else {
                    /* return the pointer matching to the first input that can be used */
                    *selected = candidates[i];
                    goto Exit;
                }
            }
        }
        /* first position of the server list matched (server_preference) */
        if (found_index == 0)
            break;
        /* server preference is overridden only if the first entry of client-provided list is chachapoly */
        server_chacha_priority = 0;
    }
    if (found_index != SIZE_MAX) {
        *selected = candidates[found_index];
        ret = 0;
    } else {
        ret = PTLS_ALERT_HANDSHAKE_FAILURE;
    }

Exit:
    return ret;
}